

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  Precision PVar1;
  bool bVar2;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Candidate *pCVar4;
  char *pcVar5;
  Candidate c;
  bool local_bf2;
  bool local_be1;
  spirv_cross local_a38 [32];
  spirv_cross local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [32];
  spirv_cross local_908 [32];
  spirv_cross local_8e8 [32];
  spirv_cross local_8c8 [32];
  TypedID<(spirv_cross::Types)3> local_8a8;
  TypedID<(spirv_cross::Types)3> local_8a4;
  TypedID<(spirv_cross::Types)3> local_8a0;
  SpecializationConstant local_89c;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [39];
  allocator local_809;
  string local_808 [39];
  allocator local_7e1;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [39];
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [32];
  spirv_cross local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  spirv_cross local_688 [39];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  spirv_cross local_5a0 [32];
  undefined1 local_580 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin4;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range4;
  char *local_308;
  undefined1 local_300 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  extra_names;
  char *extra_predicate;
  char *name;
  Candidate *ext_1;
  Candidate *__end3;
  Candidate *__begin3;
  CandidateVector *__range3;
  undefined1 local_1b0 [8];
  CandidateVector exts;
  Feature local_168;
  Feature feature;
  uint32_t feature_index;
  Result result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  char *local_20;
  SPIREntryPoint *local_18;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  local_18 = Compiler::get_entry_point(&this->super_Compiler);
  bVar2 = false;
  if (((this->options).es & 1U) != 0) {
    bVar2 = 100 < (this->options).version;
  }
  local_20 = "";
  if (bVar2) {
    local_20 = " es";
  }
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,&local_20);
  if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1a4)) {
    if (((this->options).enable_420pack_extension & 1U) != 0) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    bVar2 = Bitset::get(&local_18->flags,9);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"GL_ARB_shader_image_load_store",&local_41);
      require_extension_internal(this,(string *)local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  bVar2 = Bitset::get(&local_18->flags,0x115e);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"GL_ARB_post_depth_coverage",&local_79);
    require_extension_internal(this,(string *)local_78);
    ::std::__cxx11::string::~string(local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  bVar2 = Bitset::get(&local_18->flags,0x14f6);
  if ((((bVar2) || (bVar2 = Bitset::get(&local_18->flags,0x14f7), bVar2)) ||
      (bVar2 = Bitset::get(&local_18->flags,0x14f8), bVar2)) ||
     (bVar2 = Bitset::get(&local_18->flags,0x14f9), bVar2)) {
    if (((this->options).es & 1U) == 0) {
      if ((this->options).version < 0x1a4) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_f0,"GL_ARB_shader_image_load_store",&local_f1);
        require_extension_internal(this,(string *)local_f0);
        ::std::__cxx11::string::~string(local_f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_118,"GL_ARB_fragment_shader_interlock",(allocator *)((long)&__range1 + 7));
      require_extension_internal(this,(string *)local_118);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    else {
      if ((this->options).version < 0x136) {
        local_a2 = 1;
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a0,"At least ESSL 3.10 required for fragment shader interlock.",&local_a1);
        CompilerError::CompilerError(this_00,(string *)local_a0);
        local_a2 = 0;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c8,"GL_NV_fragment_shader_interlock",&local_c9);
      require_extension_internal(this,(string *)local_c8);
      ::std::__cxx11::string::~string(local_c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  __end1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(&(this->forced_extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
  pbVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&(this->forced_extensions).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1 != pbVar3; __end1 = __end1 + 0x20) {
    result.weights._28_8_ = __end1;
    bVar2 = ::std::operator==(__end1,"GL_EXT_shader_explicit_arithmetic_types_float16");
    if (bVar2) {
      statement<char_const(&)[42]>(this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
      if (((this->options).vulkan_semantics & 1U) == 0) {
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
      }
      else {
        statement<char_const(&)[63]>
                  (this,(char (*) [63])
                        "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
        statement<char_const(&)[69]>
                  (this,(char (*) [69])
                        "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
      }
      statement<char_const(&)[6]>(this,(char (*) [6])"#else");
      statement<char_const(&)[40]>(this,(char (*) [40])"#error No extension available for FP16.");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    else {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )result.weights._28_8_,
                                "GL_EXT_shader_explicit_arithmetic_types_int16");
      if (bVar2) {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_AMD_gpu_shader_int16)");
          statement<char_const(&)[45]>
                    (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[41]>
                    (this,(char (*) [41])"#error No extension available for Int16.");
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        else {
          statement<char_const(&)[67]>
                    (this,(char (*) [67])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
        }
      }
      else {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)result.weights._28_8_,"GL_ARB_post_depth_coverage");
        if (bVar2) {
          if (((this->options).es & 1U) == 0) {
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)");
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
            statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          }
          else {
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
          }
        }
        else if ((((this->options).vulkan_semantics & 1U) == 0) &&
                (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)result.weights._28_8_,"GL_ARB_shader_draw_parameters")
                , bVar2)) {
          statement<char_const(&)[8],std::__cxx11::string&>
                    (this,(char (*) [8])"#ifdef ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     result.weights._28_8_);
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                    (this,(char (*) [12])"#extension ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     result.weights._28_8_,(char (*) [10])" : enable");
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        else {
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                    (this,(char (*) [12])"#extension ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     result.weights._28_8_,(char (*) [11])0x4d9f3d);
        }
      }
    }
  }
  if (((this->options).vulkan_semantics & 1U) == 0) {
    ShaderSubgroupSupportHelper::resolve((Result *)&feature,&this->shader_subgroup_supporter);
    for (local_168 = SubgroupMask; local_168 < FeatureCount; local_168 = local_168 + SubgroupSize) {
      exts._60_4_ = local_168;
      bVar2 = ShaderSubgroupSupportHelper::is_feature_requested
                        (&this->shader_subgroup_supporter,local_168);
      if (bVar2) {
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)local_1b0,exts._60_4_,(Result *)&feature);
        bVar2 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::empty
                          ((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                            *)local_1b0);
        if (bVar2) {
          __range3._4_4_ = 6;
        }
        else {
          statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
          __begin3 = (Candidate *)local_1b0;
          __end3 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::
                   begin((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                          *)__begin3);
          ext_1 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::end
                            ((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                              *)__begin3);
          for (; __end3 != ext_1; __end3 = __end3 + 1) {
            name = (char *)__end3;
            extra_predicate = ShaderSubgroupSupportHelper::get_extension_name(*__end3);
            extra_names.stack_storage.aligned_char._248_8_ =
                 ShaderSubgroupSupportHelper::get_extra_required_extension_predicate
                           (*(Candidate *)name);
            ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                      ((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_300,(ShaderSubgroupSupportHelper *)(ulong)*(uint *)name,c);
            pcVar5 = name;
            pCVar4 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::
                     front((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                            *)local_1b0);
            local_308 = "#if";
            if ((Candidate *)pcVar5 != pCVar4) {
              local_308 = "#elif";
            }
            pcVar5 = "";
            if (*(char *)extra_names.stack_storage.aligned_char._248_8_ != '\0') {
              pcVar5 = " && ";
            }
            __range4 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)pcVar5;
            statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                      (this,&local_308,(char (*) [10])" defined(",&extra_predicate,
                       (char (*) [2])0x4dff7a,(char **)&__range4,
                       (char **)(extra_names.stack_storage.aligned_char + 0xf8));
            __end4 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::begin((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_300);
            pbVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::end((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_300);
            for (; __end4 != pbVar3; __end4 = __end4 + 0x20) {
              statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                        (this,(char (*) [12])"#extension ",__end4,(char (*) [10])" : enable");
            }
            statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                      (this,(char (*) [12])"#extension ",&extra_predicate,(char (*) [11])0x4d9f3d);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                            *)local_300);
          }
          bVar2 = ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions
                            (exts._60_4_);
          if (!bVar2) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          __range3._4_4_ = 0;
        }
        SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>::
        ~SmallVector((SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>
                      *)local_1b0);
      }
    }
  }
  __end1_1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(&(this->header_lines).
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  pbVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&(this->header_lines).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1_1 != pbVar3; __end1_1 = __end1_1 + 0x20) {
    statement<std::__cxx11::string&>(this,__end1_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)(outputs.stack_storage.aligned_char + 0xf8));
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_580);
  switch(local_18->model) {
  case ExecutionModelTessellationControl:
    bVar2 = Bitset::get(&local_18->flags,0x1a);
    if (bVar2) {
      join<char_const(&)[12],unsigned_int&>
                (local_720,(char (*) [12])0x4da232,&local_18->output_vertices);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_580,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
      ::std::__cxx11::string::~string((string *)local_720);
    }
    break;
  case ExecutionModelTessellationEvaluation:
    bVar2 = Bitset::get(&local_18->flags,0x18);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_740,"quads",&local_741);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740);
      ::std::__cxx11::string::~string(local_740);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_741);
    }
    bVar2 = Bitset::get(&local_18->flags,0x16);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_768,"triangles",&local_769);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768);
      ::std::__cxx11::string::~string(local_768);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_769);
    }
    bVar2 = Bitset::get(&local_18->flags,0x19);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_790,"isolines",&local_791);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790);
      ::std::__cxx11::string::~string(local_790);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_791);
    }
    bVar2 = Bitset::get(&local_18->flags,10);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7b8,"point_mode",&local_7b9);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8);
      ::std::__cxx11::string::~string(local_7b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
    }
    bVar2 = Bitset::get(&local_18->flags,0x19);
    if (!bVar2) {
      bVar2 = Bitset::get(&local_18->flags,4);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_7e0,"cw",&local_7e1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)(outputs.stack_storage.aligned_char + 0xf8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0);
        ::std::__cxx11::string::~string(local_7e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
      }
      bVar2 = Bitset::get(&local_18->flags,5);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_808,"ccw",&local_809);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)(outputs.stack_storage.aligned_char + 0xf8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808);
        ::std::__cxx11::string::~string(local_808);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
      }
    }
    bVar2 = Bitset::get(&local_18->flags,2);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_830,"fractional_even_spacing",&local_831);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830);
      ::std::__cxx11::string::~string(local_830);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
    }
    bVar2 = Bitset::get(&local_18->flags,3);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_858,"fractional_odd_spacing",&local_859);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_858);
      ::std::__cxx11::string::~string(local_858);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
    }
    bVar2 = Bitset::get(&local_18->flags,1);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&wg_x.constant_id,"equal_spacing",(allocator *)((long)&wg_x.id.id + 3));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &wg_x.constant_id);
      ::std::__cxx11::string::~string((string *)&wg_x.constant_id);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&wg_x.id.id + 3));
    }
    break;
  case ExecutionModelGeometry:
    bVar2 = Bitset::get(&local_18->flags,0);
    if ((bVar2) && (local_18->invocations != 1)) {
      join<char_const(&)[15],unsigned_int&>
                (local_5a0,(char (*) [15])"invocations = ",&local_18->invocations);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0);
      ::std::__cxx11::string::~string((string *)local_5a0);
    }
    bVar2 = Bitset::get(&local_18->flags,0x13);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5c0,"points",&local_5c1);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
      ::std::__cxx11::string::~string(local_5c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    }
    bVar2 = Bitset::get(&local_18->flags,0x14);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5e8,"lines",&local_5e9);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e8);
      ::std::__cxx11::string::~string(local_5e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    }
    bVar2 = Bitset::get(&local_18->flags,0x15);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_610,"lines_adjacency",&local_611);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
      ::std::__cxx11::string::~string(local_610);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_611);
    }
    bVar2 = Bitset::get(&local_18->flags,0x16);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_638,"triangles",&local_639);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638);
      ::std::__cxx11::string::~string(local_638);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_639);
    }
    bVar2 = Bitset::get(&local_18->flags,0x17);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_660,"triangles_adjacency",&local_661);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660);
      ::std::__cxx11::string::~string(local_660);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_661);
    }
    if ((local_18->geometry_passthrough & 1U) == 0) {
      join<char_const(&)[16],unsigned_int&>
                (local_688,(char (*) [16])"max_vertices = ",&local_18->output_vertices);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_580,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688);
      ::std::__cxx11::string::~string((string *)local_688);
      bVar2 = Bitset::get(&local_18->flags,0x1d);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_6a8,"triangle_strip",&local_6a9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_580,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8);
        ::std::__cxx11::string::~string(local_6a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
      }
      bVar2 = Bitset::get(&local_18->flags,0x1b);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_6d0,"points",&local_6d1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_580,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0);
        ::std::__cxx11::string::~string(local_6d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
      }
      bVar2 = Bitset::get(&local_18->flags,0x1c);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_6f8,"line_strip",&local_6f9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_580,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8);
        ::std::__cxx11::string::~string(local_6f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      }
    }
    break;
  case ExecutionModelFragment:
    if (((this->options).es & 1U) != 0) {
      PVar1 = (this->options).fragment.default_float_precision;
      if (PVar1 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      else if (PVar1 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar1 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      PVar1 = (this->options).fragment.default_int_precision;
      if (PVar1 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
      else if (PVar1 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar1 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
    }
    bVar2 = Bitset::get(&local_18->flags,9);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_928,"early_fragment_tests",&local_929);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
      ::std::__cxx11::string::~string(local_928);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_929);
    }
    bVar2 = Bitset::get(&local_18->flags,0x115e);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_950,"post_depth_coverage",&local_951);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_950);
      ::std::__cxx11::string::~string(local_950);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_951);
    }
    bVar2 = Bitset::get(&local_18->flags,0x14f6);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_978,"pixel_interlock_ordered",&local_979);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_978);
      ::std::__cxx11::string::~string(local_978);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_979);
    }
    else {
      bVar2 = Bitset::get(&local_18->flags,0x14f7);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_9a0,"pixel_interlock_unordered",&local_9a1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)(outputs.stack_storage.aligned_char + 0xf8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a0);
        ::std::__cxx11::string::~string(local_9a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
      }
      else {
        bVar2 = Bitset::get(&local_18->flags,0x14f8);
        if (bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_9c8,"sample_interlock_ordered",&local_9c9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)(outputs.stack_storage.aligned_char + 0xf8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c8
                     );
          ::std::__cxx11::string::~string(local_9c8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
        }
        else {
          bVar2 = Bitset::get(&local_18->flags,0x14f9);
          if (bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_9f0,"sample_interlock_unordered",&local_9f1);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)(outputs.stack_storage.aligned_char + 0xf8),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_9f0);
            ::std::__cxx11::string::~string(local_9f0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
          }
        }
      }
    }
    if ((((this->options).es & 1U) == 0) && (bVar2 = Bitset::get(&local_18->flags,0xe), bVar2)) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
    }
    else if ((((this->options).es & 1U) == 0) && (bVar2 = Bitset::get(&local_18->flags,0xf), bVar2))
    {
      statement<char_const(&)[43]>(this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;")
      ;
    }
    break;
  case ExecutionModelGLCompute:
    if ((local_18->workgroup_size).constant == 0) {
      join<char_const(&)[16],unsigned_int&>
                (local_8c8,(char (*) [16])"local_size_x = ",&(local_18->workgroup_size).x);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8);
      ::std::__cxx11::string::~string((string *)local_8c8);
      join<char_const(&)[16],unsigned_int&>
                (local_8e8,(char (*) [16])"local_size_y = ",&(local_18->workgroup_size).y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e8);
      ::std::__cxx11::string::~string((string *)local_8e8);
      join<char_const(&)[16],unsigned_int&>
                (local_908,(char (*) [16])"local_size_z = ",&(local_18->workgroup_size).z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
      ::std::__cxx11::string::~string((string *)local_908);
    }
    else {
      SpecializationConstant::SpecializationConstant(&wg_y);
      SpecializationConstant::SpecializationConstant(&wg_z);
      SpecializationConstant::SpecializationConstant(&local_89c);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,&wg_y,&wg_z,&local_89c);
      local_be1 = true;
      if (((this->options).vulkan_semantics & 1U) == 0) {
        TypedID<(spirv_cross::Types)3>::TypedID(&local_8a0,0);
        bVar2 = TypedID<(spirv_cross::Types)3>::operator==(&wg_y.id,&local_8a0);
        local_bf2 = false;
        if (bVar2) {
          TypedID<(spirv_cross::Types)3>::TypedID(&local_8a4,0);
          bVar2 = TypedID<(spirv_cross::Types)3>::operator==(&wg_z.id,&local_8a4);
          local_bf2 = false;
          if (bVar2) {
            TypedID<(spirv_cross::Types)3>::TypedID(&local_8a8,0);
            local_bf2 = TypedID<(spirv_cross::Types)3>::operator==(&local_89c.id,&local_8a8);
          }
        }
        local_be1 = local_bf2;
      }
      if (local_be1 != false) {
        build_workgroup_size
                  (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)(outputs.stack_storage.aligned_char + 0xf8),&wg_y,&wg_z,&local_89c);
      }
    }
  }
  bVar2 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(outputs.stack_storage.aligned_char + 0xf8));
  if (!bVar2) {
    merge(local_a18,
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)(outputs.stack_storage.aligned_char + 0xf8),", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18,
               (char (*) [6])") in;");
    ::std::__cxx11::string::~string((string *)local_a18);
  }
  bVar2 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_580);
  if (!bVar2) {
    merge(local_a38,
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)local_580,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38,
               (char (*) [7])") out;");
    ::std::__cxx11::string::~string((string *)local_a38);
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_580);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)(outputs.stack_storage.aligned_char + 0xf8));
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	    execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	    execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	    execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	{
		if (execution.workgroup_size.constant != 0)
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			inputs.push_back("pixel_interlock_ordered");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			inputs.push_back("pixel_interlock_unordered");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			inputs.push_back("sample_interlock_ordered");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			inputs.push_back("sample_interlock_unordered");

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}